

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void removePaddingBits(uchar *out,uchar *in,size_t olinebits,size_t ilinebits,uint h)

{
  uchar bit_00;
  long in_RCX;
  ulong in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  uint in_R8D;
  uchar bit;
  size_t x;
  size_t obp;
  size_t ibp;
  size_t diff;
  uint y;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  long local_30;
  uint local_28;
  uint local_24;
  ulong local_18;
  uchar *local_10;
  uchar *local_8;
  
  local_30 = in_RCX - in_RDX;
  local_38 = 0;
  local_40 = 0;
  local_24 = in_R8D;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
      bit_00 = readBitFromReversedStream(&local_38,local_10);
      setBitOfReversedStream(&local_40,local_8,bit_00);
    }
    local_38 = local_30 + local_38;
  }
  return;
}

Assistant:

static void removePaddingBits(unsigned char* out, const unsigned char* in,
                              size_t olinebits, size_t ilinebits, unsigned h)
{
  /*
  After filtering there are still padding bits if scanlines have non multiple of 8 bit amounts. They need
  to be removed (except at last scanline of (Adam7-reduced) image) before working with pure image buffers
  for the Adam7 code, the color convert code and the output to the user.
  in and out are allowed to be the same buffer, in may also be higher but still overlapping; in must
  have >= ilinebits*h bits, out must have >= olinebits*h bits, olinebits must be <= ilinebits
  also used to move bits after earlier such operations happened, e.g. in a sequence of reduced images from Adam7
  only useful if (ilinebits - olinebits) is a value in the range 1..7
  */
  unsigned y;
  size_t diff = ilinebits - olinebits;
  size_t ibp = 0, obp = 0; /*input and output bit pointers*/
  for(y = 0; y < h; ++y)
  {
    size_t x;
    for(x = 0; x < olinebits; ++x)
    {
      unsigned char bit = readBitFromReversedStream(&ibp, in);
      setBitOfReversedStream(&obp, out, bit);
    }
    ibp += diff;
  }
}